

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManUnivTfo(Gia_Man_t *p,int *pObjs,int nObjs,Vec_Int_t **pvNodes,Vec_Int_t **pvPos)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *local_60;
  Vec_Int_t *local_50;
  int local_38;
  int local_34;
  int Count;
  int i;
  Vec_Int_t **pvPos_local;
  Vec_Int_t **pvNodes_local;
  int nObjs_local;
  int *pObjs_local;
  Gia_Man_t *p_local;
  
  local_38 = 0;
  if (pvNodes != (Vec_Int_t **)0x0) {
    if (*pvNodes == (Vec_Int_t *)0x0) {
      pVVar2 = Vec_IntAlloc(100);
      *pvNodes = pVVar2;
    }
    else {
      Vec_IntClear(*pvNodes);
    }
  }
  if (pvPos != (Vec_Int_t **)0x0) {
    if (*pvPos == (Vec_Int_t *)0x0) {
      pVVar2 = Vec_IntAlloc(100);
      *pvPos = pVVar2;
    }
    else {
      Vec_IntClear(*pvPos);
    }
  }
  Gia_ManIncrementTravId(p);
  for (local_34 = 0; local_34 < nObjs; local_34 = local_34 + 1) {
    if (pvNodes == (Vec_Int_t **)0x0) {
      local_50 = (Vec_Int_t *)0x0;
    }
    else {
      local_50 = *pvNodes;
    }
    if (pvPos == (Vec_Int_t **)0x0) {
      local_60 = (Vec_Int_t *)0x0;
    }
    else {
      local_60 = *pvPos;
    }
    iVar1 = Gia_ManUnivTfo_rec(p,pObjs[local_34],local_50,local_60);
    local_38 = iVar1 + local_38;
  }
  if (pvNodes != (Vec_Int_t **)0x0) {
    Vec_IntSort(*pvNodes,0);
  }
  if (pvPos != (Vec_Int_t **)0x0) {
    Vec_IntSort(*pvPos,0);
  }
  return local_38;
}

Assistant:

int Gia_ManUnivTfo( Gia_Man_t * p, int * pObjs, int nObjs, Vec_Int_t ** pvNodes, Vec_Int_t ** pvPos )
{
    int i, Count = 0;
    if ( pvNodes )
    {
        if ( *pvNodes )
            Vec_IntClear( *pvNodes );
        else
            *pvNodes = Vec_IntAlloc( 100 );
    }
    if ( pvPos )
    {
        if ( *pvPos )
            Vec_IntClear( *pvPos );
        else
            *pvPos = Vec_IntAlloc( 100 );
    }
    Gia_ManIncrementTravId( p );
    for ( i = 0; i < nObjs; i++ )
        Count += Gia_ManUnivTfo_rec( p, pObjs[i], pvNodes ? *pvNodes : NULL, pvPos ? *pvPos : NULL );
    if ( pvNodes )
        Vec_IntSort( *pvNodes, 0 );
    if ( pvPos )
        Vec_IntSort( *pvPos, 0 );
    return Count;
}